

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::fit(CDT *this)

{
  ulong uVar1;
  Matrix<double> *pMVar2;
  double *pdVar3;
  double dVar4;
  pointer pdVar5;
  pointer pLVar6;
  int iVar7;
  undefined1 auVar8 [16];
  pointer pIVar9;
  pointer pIVar10;
  ostream *poVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  long lVar13;
  uint i;
  uint uVar14;
  ulong uVar15;
  uint t;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  Shape SVar21;
  undefined1 local_108 [16];
  vector<double,_std::allocator<double>_> keys;
  vector<Interval,_std::allocator<Interval>_> intervals;
  double local_b8;
  double output;
  Matrix<double> mat;
  
  dVar4 = (this->m_info).bias;
  DataSet::matrix(&mat,&this->m_dataset);
  std::operator<<((ostream *)&std::cout,"Dataset bias: ");
  poVar11 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar11,'\n');
  keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pMVar2 = &this->m_input;
  for (uVar14 = 0; uVar14 < (pMVar2->m_shape).n_row; uVar14 = uVar14 + 1) {
    intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&keys,(double *)&intervals);
  }
  pvVar12 = Matrix<double>::operator[]
                      (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_weights,0);
  *(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  uVar15._0_4_ = (pMVar2->m_shape).n_row;
  uVar15._4_4_ = (pMVar2->m_shape).n_col;
  uVar17 = 0;
  while (iVar7 = (int)(uVar15 >> 0x20), uVar17 < iVar7 - 1) {
    pvVar12 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    uVar1 = uVar17 + 1;
    pdVar5 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar16 = 0; uVar15._0_4_ = (pMVar2->m_shape).n_row, uVar15._4_4_ = (pMVar2->m_shape).n_col,
        uVar16 < (uVar15 & 0xffffffff); uVar16 = uVar16 + 1) {
      pvVar12 = Matrix<double>::operator[]
                          (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
      dVar19 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      local_108._0_8_ = dVar19;
      pvVar12 = Matrix<double>::operator[](pMVar2,(uint)uVar16);
      keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar16] =
           dVar19 * (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar17] +
           keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar16];
    }
    for (uVar16 = 0; uVar17 = uVar1, uVar16 < (int)uVar15 - 1; uVar16 = uVar16 + 1) {
      if (keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16] <=
          keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16 + 1] &&
          keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16 + 1] !=
          keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16]) {
        uVar14 = (uint)uVar16;
        pvVar12 = Matrix<double>::operator[](pMVar2,uVar14);
        dVar19 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar1];
        local_108._0_8_ = dVar19;
        pvVar12 = Matrix<double>::operator[](pMVar2,uVar14 + 1);
        pdVar3 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar1;
        if (*pdVar3 <= dVar19 && dVar19 != *pdVar3) {
          dVar19 = keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16];
          local_108._0_8_ =
               keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16 + 1];
          pvVar12 = Matrix<double>::operator[](pMVar2,uVar14);
          dVar19 = ((double)local_108._0_8_ - dVar19) /
                   (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar1];
          if (dVar19 < pdVar5[uVar1]) {
            pdVar5[uVar1] = dVar19;
          }
        }
      }
      uVar15._0_4_ = (pMVar2->m_shape).n_row;
      uVar15._4_4_ = (pMVar2->m_shape).n_col;
    }
  }
  uVar14 = iVar7 - 1;
  for (uVar17 = 0; uVar17 < (uVar15 & 0xffffffff); uVar17 = uVar17 + 1) {
    pvVar12 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    local_108._0_8_ =
         (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar14];
    pvVar12 = Matrix<double>::operator[](pMVar2,(uint)uVar17);
    keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar17] =
         (double)local_108._0_8_ *
         (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar14] +
         keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar17];
    uVar15 = (ulong)(pMVar2->m_shape).n_row;
  }
  std::operator<<((ostream *)&std::cout,"Updated weights: ");
  for (uVar15 = 0;
      pLVar6 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start, uVar15 < (pLVar6->m_weights).m_shape.n_col;
      uVar15 = uVar15 + 1) {
    pvVar12 = Matrix<double>::operator[](&pLVar6->m_weights,0);
    poVar11 = std::ostream::_M_insert<double>
                        ((pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar15]);
    std::operator<<(poVar11,"\t");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  uVar14 = 0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108._8_8_;
  local_108 = auVar8 << 0x40;
  while( true ) {
    pvVar12 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    if ((ulong)((long)(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)uVar14) break;
    pvVar12 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    local_108._0_8_ =
         (double)local_108._0_8_ +
         (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar14] * dVar4;
    uVar14 = uVar14 + 1;
  }
  for (uVar14 = 0; uVar15 = (ulong)uVar14,
      uVar15 < (ulong)((long)keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1) {
    keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar15] =
         keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar15] - (double)local_108._0_8_;
  }
  std::operator<<((ostream *)&std::cout,"Key bias: ");
  poVar11 = std::ostream::_M_insert<double>((double)local_108._0_8_);
  std::operator<<(poVar11,'\n');
  std::operator<<((ostream *)&std::cout," > Initializing intervals...\n");
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar2 = &this->m_output;
  pvVar12 = Matrix<double>::operator[](pMVar2,0);
  output = *(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b8 = 0.0;
  for (uVar14 = 0; uVar15 = (ulong)uVar14,
      uVar15 < (ulong)((long)keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1) {
    pvVar12 = Matrix<double>::operator[](pMVar2,uVar14);
    dVar4 = *(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((dVar4 != output) || (NAN(dVar4) || NAN(output))) {
      std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                ((vector<Interval,std::allocator<Interval>> *)&intervals,
                 keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 ((long)local_b8 >> 0x3f & (long)(local_b8 - 9.223372036854776e+18) | (long)local_b8
                 ),keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(double)local_108._0_8_ >> 0x3f &
                    (long)((double)local_108._0_8_ - 9.223372036854776e+18) |
                   (long)(double)local_108._0_8_),&output);
      uVar18 = local_108._12_4_;
      local_b8 = (double)local_108._0_8_ + 1.0;
      local_108._8_4_ = local_108._8_4_;
      local_108._0_8_ = local_b8;
      local_108._12_4_ = uVar18;
      pvVar12 = Matrix<double>::operator[](pMVar2,(uint)(long)local_b8);
      output = *(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      local_108._8_8_ = 0;
      local_108._0_8_ = (double)uVar15;
    }
    if (((long)keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U == uVar15) {
      std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                ((vector<Interval,std::allocator<Interval>> *)&intervals,
                 keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 ((long)local_b8 >> 0x3f & (long)(local_b8 - 9.223372036854776e+18) | (long)local_b8
                 ),keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(double)local_108._0_8_ >> 0x3f &
                    (long)((double)local_108._0_8_ - 9.223372036854776e+18) |
                   (long)(double)local_108._0_8_),&output);
    }
  }
  std::operator<<((ostream *)&std::cout,"Overfit rate: ");
  pIVar10 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pIVar9 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar21 = DataSet::shape(&this->m_dataset);
  lVar13 = ((long)pIVar10 - (long)pIVar9) / 0x18;
  auVar20._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar20._0_8_ = lVar13;
  auVar20._12_4_ = 0x45300000;
  poVar11 = std::ostream::_M_insert<double>
                      (((auVar20._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                       (double)(SVar21._0_8_ & 0xffffffff));
  std::operator<<(poVar11,'\n');
  Activation::initialize(&this->m_function,&intervals);
  std::_Vector_base<Interval,_std::allocator<Interval>_>::~_Vector_base
            (&intervals.super__Vector_base<Interval,_std::allocator<Interval>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&keys.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&mat.m_elems);
  return;
}

Assistant:

void CDT::fit(){
    double bias=m_info.bias;
    Matrix_d mat=m_dataset.matrix();
    std::cout<<"Dataset bias: "<<bias<<'\n';

    // std::cout<<"dc sort:\n"<<m_input<<'\n'<<m_output<<'\n';

    std::vector<double> keys;
    for(unsigned i=0;i<m_input.shape().n_row;++i)
        keys.push_back(0.);
    
    m_layers[0].m_weights[0][0]=1.;
    for(unsigned i=0;i<m_input.shape().n_col-1;++i){
        double& weight=m_layers[0].m_weights[0][i+1];
        for(unsigned t=0;t<m_input.shape().n_row;++t){
            keys[t]+=m_layers[0].m_weights[0][i]*m_input[t][i];
        }
        for(unsigned j=0;j<m_input.shape().n_row-1;++j){
            if(keys[j]<keys[j+1] &&
               m_input[j][i+1]>m_input[j+1][i+1]){
                   double tmp;
                   tmp=(keys[j+1]-keys[j])/m_input[j][i+1];
                   if(weight>tmp) weight=tmp;
               }
        }
    }
    unsigned col=m_input.shape().n_col;
    for(unsigned i=0;i<m_input.shape().n_row;++i){
        keys[i]+=m_layers[0].m_weights[0][col-1]*m_input[i][col-1];
    }

    std::cout<<"Updated weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<"\t";
    }   std::cout<<'\n';

    // Normalizing keys
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // } std::cout<<'\n';

    double key_bias=0.;
    for(unsigned i=0;i<m_layers[0].m_weights[0].size();++i){
        // std::cout<<" |> +"<<m_layers[0].m_weights[0][i]<<" * "<<bias<<'\n';
        key_bias+=m_layers[0].m_weights[0][i]*bias;
    }
    for(unsigned i=0;i<keys.size();++i){
        keys[i]-=key_bias;
    }
    
    std::cout<<"Key bias: "<<key_bias<<'\n';
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // }   std::cout<<'\n';

    std::cout<<" > Initializing intervals...\n";
    
    std::vector<Interval> intervals;
    double beg=0, end, output=m_output[0][0];
    for(unsigned i=0;i<keys.size();++i){
        if(m_output[i][0]==output){
            end=i;
        }
        else{
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
            
            beg=++end;
            output=m_output[beg][0];
        }

        if(i==keys.size()-1){
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
        }
    }
    std::cout<<"Overfit rate: "<<intervals.size()/(double)m_dataset.shape().n_row<<'\n';
    m_function.initialize(intervals);
}